

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# architecture.cc
# Opt level: O0

void __thiscall Architecture::~Architecture(Architecture *this)

{
  Database *this_00;
  OptionDatabase *this_01;
  int iVar1;
  bool bVar2;
  reference ppTVar3;
  ulong uVar4;
  size_type sVar5;
  reference ppRVar6;
  reference ppPVar7;
  reference ppVar8;
  iterator local_60;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ProtoModel_*>_>
  local_58;
  iterator local_50;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ProtoModel_*>_>
  local_48;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ProtoModel_*>_>
  local_40;
  const_iterator piter;
  int4 i_1;
  int4 i;
  TypeOp **local_28;
  TypeOp *local_20;
  TypeOp *t_op;
  iterator iter;
  Architecture *this_local;
  
  (this->super_AddrSpaceManager)._vptr_AddrSpaceManager = (_func_int **)&PTR__Architecture_00849298;
  iter._M_current = (TypeOp **)this;
  __gnu_cxx::__normal_iterator<TypeOp_**,_std::vector<TypeOp_*,_std::allocator<TypeOp_*>_>_>::
  __normal_iterator((__normal_iterator<TypeOp_**,_std::vector<TypeOp_*,_std::allocator<TypeOp_*>_>_>
                     *)&t_op);
  local_28 = (TypeOp **)std::vector<TypeOp_*,_std::allocator<TypeOp_*>_>::begin(&this->inst);
  t_op = (TypeOp *)local_28;
  while( true ) {
    _i_1 = std::vector<TypeOp_*,_std::allocator<TypeOp_*>_>::end(&this->inst);
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<TypeOp_**,_std::vector<TypeOp_*,_std::allocator<TypeOp_*>_>_>
                        *)&t_op,(__normal_iterator<TypeOp_**,_std::vector<TypeOp_*,_std::allocator<TypeOp_*>_>_>
                                 *)&i_1);
    if (!bVar2) break;
    ppTVar3 = __gnu_cxx::
              __normal_iterator<TypeOp_**,_std::vector<TypeOp_*,_std::allocator<TypeOp_*>_>_>::
              operator*((__normal_iterator<TypeOp_**,_std::vector<TypeOp_*,_std::allocator<TypeOp_*>_>_>
                         *)&t_op);
    local_20 = *ppTVar3;
    if ((local_20 != (TypeOp *)0x0) && (local_20 != (TypeOp *)0x0)) {
      (*local_20->_vptr_TypeOp[4])();
    }
    __gnu_cxx::__normal_iterator<TypeOp_**,_std::vector<TypeOp_*,_std::allocator<TypeOp_*>_>_>::
    operator++((__normal_iterator<TypeOp_**,_std::vector<TypeOp_*,_std::allocator<TypeOp_*>_>_> *)
               &t_op);
  }
  for (piter._M_node._4_4_ = 0; uVar4 = (ulong)piter._M_node._4_4_,
      sVar5 = std::vector<Rule_*,_std::allocator<Rule_*>_>::size(&this->extra_pool_rules),
      uVar4 < sVar5; piter._M_node._4_4_ = piter._M_node._4_4_ + 1) {
    ppRVar6 = std::vector<Rule_*,_std::allocator<Rule_*>_>::operator[]
                        (&this->extra_pool_rules,(long)piter._M_node._4_4_);
    if (*ppRVar6 != (value_type)0x0) {
      (*(*ppRVar6)->_vptr_Rule[1])();
    }
  }
  this_00 = this->symboltab;
  if (this_00 != (Database *)0x0) {
    Database::~Database(this_00);
    operator_delete(this_00);
  }
  for (piter._M_node._0_4_ = 0; iVar1 = (int)piter._M_node,
      sVar5 = std::vector<PrintLanguage_*,_std::allocator<PrintLanguage_*>_>::size(&this->printlist)
      , iVar1 < (int)sVar5; piter._M_node._0_4_ = (int)piter._M_node + 1) {
    ppPVar7 = std::vector<PrintLanguage_*,_std::allocator<PrintLanguage_*>_>::operator[]
                        (&this->printlist,(long)(int)piter._M_node);
    if (*ppPVar7 != (value_type)0x0) {
      (*(*ppPVar7)->_vptr_PrintLanguage[0x11])();
    }
  }
  this_01 = this->options;
  if (this_01 != (OptionDatabase *)0x0) {
    OptionDatabase::~OptionDatabase(this_01);
    operator_delete(this_01);
  }
  std::
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ProtoModel_*>_>
  ::_Rb_tree_const_iterator(&local_40);
  local_50._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ProtoModel_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ProtoModel_*>_>_>
       ::begin(&this->protoModels);
  std::
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ProtoModel_*>_>
  ::_Rb_tree_const_iterator(&local_48,&local_50);
  local_40._M_node = local_48._M_node;
  while( true ) {
    local_60._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ProtoModel_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ProtoModel_*>_>_>
         ::end(&this->protoModels);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ProtoModel_*>_>
    ::_Rb_tree_const_iterator(&local_58,&local_60);
    bVar2 = std::operator!=(&local_40,&local_58);
    if (!bVar2) break;
    ppVar8 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ProtoModel_*>_>
             ::operator*(&local_40);
    if (ppVar8->second != (ProtoModel *)0x0) {
      (*ppVar8->second->_vptr_ProtoModel[1])();
    }
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ProtoModel_*>_>
    ::operator++(&local_40);
  }
  if ((this->types != (TypeFactory *)0x0) && (this->types != (TypeFactory *)0x0)) {
    (*this->types->_vptr_TypeFactory[2])();
  }
  if ((this->translate != (Translate *)0x0) && (this->translate != (Translate *)0x0)) {
    (*(this->translate->super_AddrSpaceManager)._vptr_AddrSpaceManager[1])();
  }
  if ((this->loader != (LoadImage *)0x0) && (this->loader != (LoadImage *)0x0)) {
    (*this->loader->_vptr_LoadImage[1])();
  }
  if ((this->pcodeinjectlib != (PcodeInjectLibrary *)0x0) &&
     (this->pcodeinjectlib != (PcodeInjectLibrary *)0x0)) {
    (*this->pcodeinjectlib->_vptr_PcodeInjectLibrary[3])();
  }
  if ((this->commentdb != (CommentDatabase *)0x0) && (this->commentdb != (CommentDatabase *)0x0)) {
    (*this->commentdb->_vptr_CommentDatabase[1])();
  }
  if ((this->cpool != (ConstantPool *)0x0) && (this->cpool != (ConstantPool *)0x0)) {
    (*this->cpool->_vptr_ConstantPool[2])();
  }
  if ((this->context != (ContextDatabase *)0x0) && (this->context != (ContextDatabase *)0x0)) {
    (*this->context->_vptr_ContextDatabase[7])();
  }
  ActionDatabase::~ActionDatabase(&this->allacts);
  std::vector<PreferSplitRecord,_std::allocator<PreferSplitRecord>_>::~vector(&this->splitrecords);
  UserOpManage::~UserOpManage(&this->userops);
  std::vector<TypeOp_*,_std::allocator<TypeOp_*>_>::~vector(&this->inst);
  std::vector<PrintLanguage_*,_std::allocator<PrintLanguage_*>_>::~vector(&this->printlist);
  RangeList::~RangeList(&this->nohighptr);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ProtoModel_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ProtoModel_*>_>_>
  ::~map(&this->protoModels);
  std::vector<Rule_*,_std::allocator<Rule_*>_>::~vector(&this->extra_pool_rules);
  std::__cxx11::string::~string((string *)&this->archid);
  AddrSpaceManager::~AddrSpaceManager(&this->super_AddrSpaceManager);
  return;
}

Assistant:

Architecture::~Architecture(void)

{				// Delete anything that was allocated
  vector<TypeOp *>::iterator iter;
  TypeOp *t_op;

  for(iter=inst.begin();iter!=inst.end();++iter) {
    t_op = *iter;
    if (t_op != (TypeOp *)0)
      delete t_op;
  }
  for(int4 i=0;i<extra_pool_rules.size();++i)
    delete extra_pool_rules[i];

  delete symboltab;
  for(int4 i=0;i<(int4)printlist.size();++i)
    delete printlist[i];
  delete options;
#ifdef CPUI_STATISTICS
  delete stats;
#endif

  map<string,ProtoModel *>::const_iterator piter;
  for(piter=protoModels.begin();piter!=protoModels.end();++piter)
    delete (*piter).second;

  if (types != (TypeFactory *)0)
    delete types;
  if (translate != (Translate *)0)
    delete translate;
  if (loader != (LoadImage *)0)
    delete loader;
  if (pcodeinjectlib != (PcodeInjectLibrary *)0)
    delete pcodeinjectlib;
  if (commentdb != (CommentDatabase *)0)
    delete commentdb;
  if (cpool != (ConstantPool *)0)
    delete cpool;
  if (context != (ContextDatabase *)0)
    delete context;
}